

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O1

void __thiscall
capnp::EzRpcServer::Impl::Impl
          (Impl *this,Client *mainInterface,int socketFd,uint port,ReaderOptions readerOpts)

{
  _Rb_tree_header *p_Var1;
  LowLevelAsyncIoProvider *pLVar2;
  ConnectionReceiver *pCVar3;
  ReaderOptions readerOpts_00;
  Own<kj::ConnectionReceiver> local_50;
  Disposer *local_40;
  ConnectionReceiver *pCStack_38;
  uint local_2c;
  
  (this->super_SturdyRefRestorer<capnp::AnyPointer>).super_SturdyRefRestorerBase.
  _vptr_SturdyRefRestorerBase = (_func_int **)&PTR_baseRestore_00647e30;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00647e58;
  (this->mainInterface).hook.disposer = (mainInterface->hook).disposer;
  (this->mainInterface).hook.ptr = (mainInterface->hook).ptr;
  (mainInterface->hook).ptr = (ClientHook *)0x0;
  EzRpcContext::getThreadLocal();
  p_Var1 = &(this->exportMap)._M_t._M_impl.super__Rb_tree_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c = port;
  kj::heap<kj::_::ImmediatePromiseNode<unsigned_int>,unsigned_int>((kj *)&local_50,&local_2c);
  local_40 = local_50.disposer;
  pCStack_38 = local_50.ptr;
  kj::Promise<unsigned_int>::fork((Promise<unsigned_int> *)&this->portPromise);
  pCVar3 = pCStack_38;
  if (pCStack_38 != (ConnectionReceiver *)0x0) {
    pCStack_38 = (ConnectionReceiver *)0x0;
    (**local_40->_vptr_Disposer)
              (local_40,(_func_int *)
                        ((long)&pCVar3->_vptr_ConnectionReceiver +
                        (long)pCVar3->_vptr_ConnectionReceiver[-2]));
  }
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler);
  pLVar2 = (((this->context).ptr)->ioContext).lowLevelProvider.ptr;
  (*pLVar2->_vptr_LowLevelAsyncIoProvider[5])
            (&local_50,pLVar2,(ulong)(uint)socketFd,&(anonymous_namespace)::DUMMY_FILTER,0);
  readerOpts_00._8_8_ = readerOpts._8_8_ & 0xffffffff;
  readerOpts_00.traversalLimitInWords = readerOpts.traversalLimitInWords;
  acceptLoop(this,&local_50,readerOpts_00);
  pCVar3 = local_50.ptr;
  if (local_50.ptr != (ConnectionReceiver *)0x0) {
    local_50.ptr = (ConnectionReceiver *)0x0;
    (**(local_50.disposer)->_vptr_Disposer)
              (local_50.disposer,
               (_func_int *)
               ((long)&pCVar3->_vptr_ConnectionReceiver + (long)pCVar3->_vptr_ConnectionReceiver[-2]
               ));
  }
  return;
}

Assistant:

Impl(Capability::Client mainInterface, int socketFd, uint port, ReaderOptions readerOpts)
      : mainInterface(kj::mv(mainInterface)),
        context(EzRpcContext::getThreadLocal()),
        portPromise(kj::Promise<uint>(port).fork()),
        tasks(*this) {
    acceptLoop(context->getLowLevelIoProvider().wrapListenSocketFd(socketFd, DUMMY_FILTER),
               readerOpts);
  }